

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueue_UniqueCheck::test_method(test_CheckQueue_UniqueCheck *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool r_1;
  size_t k;
  size_t r;
  size_t i;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  size_t total;
  size_t COUNT;
  __single_object queue;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  CCheckQueueControl<UniqueCheck> control;
  char *in_stack_fffffffffffffe28;
  __native_type *in_stack_fffffffffffffe30;
  assertion_result *in_stack_fffffffffffffe38;
  unsigned_long *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 fTry;
  int in_stack_fffffffffffffe4c;
  lazy_ostream *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  size_t line_num;
  const_string *in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  undefined1 in_stack_fffffffffffffe6f;
  bool local_159;
  ulong local_158;
  const_string local_130 [2];
  lazy_ostream local_110 [2];
  assertion_result local_f0;
  ulong uVar3;
  undefined1 local_98 [88];
  long lVar4;
  __native_type local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<UniqueCheck>,unsigned_int_const&,int_const&>
            ((uint *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_38.__align = 100000;
  lVar4 = 100000;
  std::unique_ptr<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>::get
            ((unique_ptr<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
              *)in_stack_fffffffffffffe28);
  CCheckQueueControl<UniqueCheck>::CCheckQueueControl
            ((CCheckQueueControl<UniqueCheck> *)in_stack_fffffffffffffe38,
             (CCheckQueue<FakeCheckCheckCompletion> *)&in_stack_fffffffffffffe30->__data);
  while (lVar4 != 0) {
    iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                      ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c);
    std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::vector
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffffe28);
    for (local_158 = 0; local_158 < (ulong)(long)iVar2 && lVar4 != 0; local_158 = local_158 + 1) {
      lVar4 = lVar4 + -1;
      std::vector<UniqueCheck,std::allocator<UniqueCheck>>::emplace_back<unsigned_long&>
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 in_stack_fffffffffffffe40);
    }
    CCheckQueueControl<UniqueCheck>::Add
              ((CCheckQueueControl<UniqueCheck> *)in_stack_fffffffffffffe38,
               (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               &in_stack_fffffffffffffe30->__data);
    std::vector<UniqueCheck,_std::allocator<UniqueCheck>_>::~vector
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffffe38);
  }
  CCheckQueueControl<UniqueCheck>::~CCheckQueueControl
            ((CCheckQueueControl<UniqueCheck> *)in_stack_fffffffffffffe38);
  fTry = (undefined1)((uint)in_stack_fffffffffffffe48 >> 0x18);
  MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffe28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT17(in_stack_fffffffffffffe6f,
                      CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
             (AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffe60,
             (char *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe4c,(bool)fTry);
  local_159 = true;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30->__size,(unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
               in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58,
               (const_string *)in_stack_fffffffffffffe50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffffe30->__data,
               (char (*) [1])in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30->__size,(unsigned_long)in_stack_fffffffffffffe28);
    std::
    unordered_multiset<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::size((unordered_multiset<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            *)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe38 = (assertion_result *)0x1ea1313;
    in_stack_fffffffffffffe30 = &local_38;
    in_stack_fffffffffffffe28 = "UniqueCheck::results.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_98,&stack0xffffffffffffff58,0x11d,2,2,&stack0xffffffffffffff50);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe6f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe6f);
  for (uVar3 = 0; uVar3 < (ulong)local_38.__align; uVar3 = uVar3 + 1) {
    in_stack_fffffffffffffe6e = false;
    if (local_159 != false) {
      in_stack_fffffffffffffe60 =
           (const_string *)
           std::
           unordered_multiset<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::count((unordered_multiset<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)in_stack_fffffffffffffe38,(key_type *)&in_stack_fffffffffffffe30->__align);
      in_stack_fffffffffffffe6e = in_stack_fffffffffffffe60 == (const_string *)0x1;
    }
    local_159 = (bool)in_stack_fffffffffffffe6e;
  }
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30->__size,(unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)
               CONCAT17(in_stack_fffffffffffffe6f,
                        CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),
               in_stack_fffffffffffffe60,line_num,(const_string *)in_stack_fffffffffffffe50);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe38,SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
    in_stack_fffffffffffffe50 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30->__size,(unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffffe30->__data,
               (basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30->__size,(unsigned_long)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe28 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_f0,local_110,local_130,0x121,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffe28);
  std::unique_ptr<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>::
  ~unique_ptr((unique_ptr<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
               *)in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_UniqueCheck)
{
    auto queue = std::make_unique<Unique_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    size_t COUNT = 100000;
    size_t total = COUNT;
    {
        CCheckQueueControl<UniqueCheck> control(queue.get());
        while (total) {
            size_t r = m_rng.randrange(10);
            std::vector<UniqueCheck> vChecks;
            for (size_t k = 0; k < r && total; k++)
                vChecks.emplace_back(--total);
            control.Add(std::move(vChecks));
        }
    }
    {
        LOCK(UniqueCheck::m);
        bool r = true;
        BOOST_REQUIRE_EQUAL(UniqueCheck::results.size(), COUNT);
        for (size_t i = 0; i < COUNT; ++i) {
            r = r && UniqueCheck::results.count(i) == 1;
        }
        BOOST_REQUIRE(r);
    }
}